

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::getCentroidalTotalMomentum
          (KinDynComputations *this,Span<double,__1L> spatial_momentum)

{
  index_type iVar1;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *in_RDI;
  bool ok;
  int expected_spatial_momentum_size;
  KinDynComputations *in_stack_000001c8;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *other;
  storage_type<iDynTree::details::extent_type<_1L>_> in_stack_ffffffffffffff50;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_90 [72];
  SpatialForceVector *in_stack_ffffffffffffffb8;
  
  iVar1 = Span<double,_-1L>::size((Span<double,__1L> *)0x1cf7d4);
  if (iVar1 == 6) {
    other = local_90;
    getCentroidalTotalMomentum(in_stack_000001c8);
    toEigen(in_stack_ffffffffffffffb8);
    toEigen((Span<double,__1L>)in_stack_ffffffffffffff50);
    Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=(in_RDI,other);
    SpatialMomentum::~SpatialMomentum((SpatialMomentum *)0x1cf87c);
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","getCentroidalTotalMomentum",
               "Wrong size in input spatial_momentum");
  }
  return iVar1 == 6;
}

Assistant:

bool KinDynComputations::getCentroidalTotalMomentum(iDynTree::Span<double> spatial_momentum)
{
    constexpr int expected_spatial_momentum_size = 6;
    bool ok = spatial_momentum.size() == expected_spatial_momentum_size;
    if( !ok )
    {
        reportError("KinDynComputations","getCentroidalTotalMomentum","Wrong size in input spatial_momentum");
        return false;
    }

    toEigen(spatial_momentum) = toEigen(getCentroidalTotalMomentum());

    return true;
}